

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageLoadStoreTestInstance::prepareDescriptors
          (ImageLoadStoreTestInstance *this)

{
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  VkImageSubresourceRange subresourceRange_03;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  DeviceInterface *pDVar1;
  DeviceInterface *pDVar2;
  ImageType IVar3;
  DescriptorSetLayoutBuilder *pDVar4;
  DescriptorPoolBuilder *pDVar5;
  Handle<(vk::HandleType)21> *pHVar6;
  Handle<(vk::HandleType)19> *pHVar7;
  reference pvVar8;
  Image *pIVar9;
  VkImage *pVVar10;
  reference pvVar11;
  Move<vk::Handle<(vk::HandleType)13>_> local_308;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_2e8;
  undefined1 local_2d8 [16];
  deUint32 local_2c8;
  deUint64 local_2b8;
  Move<vk::Handle<(vk::HandleType)13>_> local_2b0;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_290;
  deUint64 local_280;
  VkDescriptorPool local_278;
  Move<vk::Handle<(vk::HandleType)22>_> local_270;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> local_250;
  undefined1 auStack_240 [8];
  VkImageSubresourceRange subresourceRange_1;
  VkImageViewType viewType_1;
  Move<vk::Handle<(vk::HandleType)13>_> local_208;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_1e8;
  undefined1 local_1d8 [16];
  deUint32 local_1c8;
  deUint64 local_1b8;
  Move<vk::Handle<(vk::HandleType)13>_> local_1b0;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_190;
  deUint64 local_180;
  VkDescriptorPool local_178;
  Move<vk::Handle<(vk::HandleType)22>_> local_170;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> local_150;
  undefined1 auStack_13c [8];
  VkImageSubresourceRange subresourceRange;
  VkImageViewType viewType;
  int layerNdx;
  Move<vk::Handle<(vk::HandleType)21>_> local_108;
  RefData<vk::Handle<(vk::HandleType)21>_> local_e8;
  DescriptorSetLayoutBuilder local_b8;
  Move<vk::Handle<(vk::HandleType)19>_> local_70;
  RefData<vk::Handle<(vk::HandleType)19>_> local_50;
  deUint32 local_2c;
  DeviceInterface *pDStack_28;
  int numLayers;
  DeviceInterface *vk;
  VkDevice device;
  ImageLoadStoreTestInstance *this_local;
  
  device = (VkDevice)this;
  vk = (DeviceInterface *)
       Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                          super_TestInstance.m_context);
  pDStack_28 = Context::getDeviceInterface
                         ((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                          super_TestInstance.m_context);
  local_2c = Texture::numLayers(&(this->super_LoadStoreTestInstance).super_BaseTestInstance.
                                 m_texture);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_b8);
  pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_b8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  pDVar4 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar4,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_70,pDVar4,pDStack_28,(VkDevice)vk,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_50,(Move *)&local_70);
  data.deleter.m_deviceIface = local_50.deleter.m_deviceIface;
  data.object.m_internal = local_50.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_50.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_50.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_50.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_70);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_b8);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&viewType);
  pDVar5 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&viewType,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,local_2c);
  pDVar5 = ::vk::DescriptorPoolBuilder::addType(pDVar5,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,local_2c);
  ::vk::DescriptorPoolBuilder::build(&local_108,pDVar5,pDStack_28,(VkDevice)vk,1,local_2c);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_e8.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_108);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder((DescriptorPoolBuilder *)&viewType);
  if (((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_singleLayerBind & 1U) == 0) {
    IVar3 = Texture::type(&(this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture);
    subresourceRange_1.baseArrayLayer = mapImageViewType(IVar3);
    ::vk::makeImageSubresourceRange((VkImageSubresourceRange *)auStack_240,1,0,1,0,local_2c);
    pDVar2 = vk;
    pDVar1 = pDStack_28;
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                       (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    local_278.m_internal = pHVar6->m_internal;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_descriptorSetLayout).
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    local_280 = pHVar7->m_internal;
    makeDescriptorSet(&local_270,pDVar1,(VkDevice)pDVar2,local_278,(VkDescriptorSetLayout)local_280)
    ;
    makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>((image *)&local_250,&local_270);
    pvVar8 = std::
             vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
             ::operator[](&this->m_allDescriptorSets,0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              (pvVar8,&local_250);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr(&local_250);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_270);
    pDVar2 = vk;
    pDVar1 = pDStack_28;
    pIVar9 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
             operator->(&(this->m_imageSrc).
                         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                       );
    pVVar10 = image::Image::get(pIVar9);
    local_2b8 = pVVar10->m_internal;
    local_2c8 = subresourceRange_1.levelCount;
    local_2d8._0_8_ = auStack_240;
    local_2d8._8_4_ = subresourceRange_1.aspectMask;
    local_2d8._12_4_ = subresourceRange_1.baseMipLevel;
    subresourceRange_02.levelCount = subresourceRange_1.aspectMask;
    subresourceRange_02.baseArrayLayer = subresourceRange_1.baseMipLevel;
    subresourceRange_02.aspectMask = auStack_240._0_4_;
    subresourceRange_02.baseMipLevel = auStack_240._4_4_;
    subresourceRange_02.layerCount = subresourceRange_1.levelCount;
    makeImageView(&local_2b0,pDVar1,(VkDevice)pDVar2,(VkImage)local_2b8,
                  subresourceRange_1.baseArrayLayer,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_02);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((image *)&local_290,&local_2b0);
    pvVar11 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&this->m_allSrcImageViews,0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              (pvVar11,&local_290);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_290);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_2b0);
    pDVar2 = vk;
    pDVar1 = pDStack_28;
    pIVar9 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
             operator->(&(this->m_imageDst).
                         super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                       );
    pVVar10 = image::Image::get(pIVar9);
    subresourceRange_03.levelCount = subresourceRange_1.aspectMask;
    subresourceRange_03.baseArrayLayer = subresourceRange_1.baseMipLevel;
    subresourceRange_03.aspectMask = auStack_240._0_4_;
    subresourceRange_03.baseMipLevel = auStack_240._4_4_;
    subresourceRange_03.layerCount = subresourceRange_1.levelCount;
    makeImageView(&local_308,pDVar1,(VkDevice)pDVar2,(VkImage)pVVar10->m_internal,
                  subresourceRange_1.baseArrayLayer,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_03);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((image *)&local_2e8,&local_308);
    pvVar11 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&this->m_allDstImageViews,0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              (pvVar11,&local_2e8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_2e8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_308);
  }
  else {
    for (subresourceRange.layerCount = 0; (int)subresourceRange.layerCount < (int)local_2c;
        subresourceRange.layerCount = subresourceRange.layerCount + 1) {
      IVar3 = Texture::type(&(this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture);
      IVar3 = getImageTypeForSingleLayer(IVar3);
      subresourceRange.baseArrayLayer = mapImageViewType(IVar3);
      ::vk::makeImageSubresourceRange
                ((VkImageSubresourceRange *)auStack_13c,1,0,1,subresourceRange.layerCount,1);
      pDVar2 = vk;
      pDVar1 = pDStack_28;
      pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                         (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
      local_178.m_internal = pHVar6->m_internal;
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                         (&(this->m_descriptorSetLayout).
                           super_RefBase<vk::Handle<(vk::HandleType)19>_>);
      local_180 = pHVar7->m_internal;
      makeDescriptorSet(&local_170,pDVar1,(VkDevice)pDVar2,local_178,
                        (VkDescriptorSetLayout)local_180);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>((image *)&local_150,&local_170);
      pvVar8 = std::
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ::operator[](&this->m_allDescriptorSets,(long)(int)subresourceRange.layerCount);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
                (pvVar8,&local_150);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
                (&local_150);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_170);
      pDVar2 = vk;
      pDVar1 = pDStack_28;
      pIVar9 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
               operator->(&(this->m_imageSrc).
                           super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                         );
      pVVar10 = image::Image::get(pIVar9);
      local_1b8 = pVVar10->m_internal;
      local_1c8 = subresourceRange.levelCount;
      local_1d8._0_8_ = auStack_13c;
      local_1d8._8_4_ = subresourceRange.aspectMask;
      local_1d8._12_4_ = subresourceRange.baseMipLevel;
      subresourceRange_00.levelCount = subresourceRange.aspectMask;
      subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
      subresourceRange_00.aspectMask = auStack_13c._0_4_;
      subresourceRange_00.baseMipLevel = auStack_13c._4_4_;
      subresourceRange_00.layerCount = subresourceRange.levelCount;
      makeImageView(&local_1b0,pDVar1,(VkDevice)pDVar2,(VkImage)local_1b8,
                    subresourceRange.baseArrayLayer,
                    (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                    subresourceRange_00);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((image *)&local_190,&local_1b0);
      pvVar11 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ::operator[](&this->m_allSrcImageViews,(long)(int)subresourceRange.layerCount);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                (pvVar11,&local_190);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                (&local_190);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_1b0);
      pDVar2 = vk;
      pDVar1 = pDStack_28;
      pIVar9 = de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::
               operator->(&(this->m_imageDst).
                           super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                         );
      pVVar10 = image::Image::get(pIVar9);
      subresourceRange_1.layerCount = auStack_13c._0_4_;
      viewType_1 = auStack_13c._4_4_;
      subresourceRange_01.levelCount = subresourceRange.aspectMask;
      subresourceRange_01.baseArrayLayer = subresourceRange.baseMipLevel;
      subresourceRange_01.aspectMask = auStack_13c._0_4_;
      subresourceRange_01.baseMipLevel = auStack_13c._4_4_;
      subresourceRange_01.layerCount = subresourceRange.levelCount;
      makeImageView(&local_208,pDVar1,(VkDevice)pDVar2,(VkImage)pVVar10->m_internal,
                    subresourceRange.baseArrayLayer,
                    (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                    subresourceRange_01);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((image *)&local_1e8,&local_208);
      pvVar11 = std::
                vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                ::operator[](&this->m_allDstImageViews,(long)(int)subresourceRange.layerCount);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                (pvVar11,&local_1e8);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
                (&local_1e8);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_208);
    }
  }
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  return (VkDescriptorSetLayout)pHVar7->m_internal;
}

Assistant:

VkDescriptorSetLayout ImageLoadStoreTestInstance::prepareDescriptors (void)
{
	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			const VkImageViewType viewType = mapImageViewType(getImageTypeForSingleLayer(m_texture.type()));
			const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u);

			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allSrcImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
			m_allDstImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
		}
	}
	else // bind all layers at once
	{
		const VkImageViewType viewType = mapImageViewType(m_texture.type());
		const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers);

		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allSrcImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
		m_allDstImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}